

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdcolmap.c
# Opt level: O1

void add_map_entry(j_decompress_ptr cinfo,int R,int G,int B)

{
  JSAMPARRAY ppJVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  long lVar5;
  long lVar6;
  
  ppJVar1 = cinfo->colormap;
  pJVar2 = *ppJVar1;
  pJVar3 = ppJVar1[1];
  pJVar4 = ppJVar1[2];
  lVar6 = (long)cinfo->actual_number_of_colors;
  if (0 < lVar6) {
    lVar5 = 0;
    do {
      if ((((uint)pJVar2[lVar5] == R) && ((uint)pJVar3[lVar5] == G)) && ((uint)pJVar4[lVar5] == B))
      {
        return;
      }
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  if (0xff < cinfo->actual_number_of_colors) {
    *(undefined8 *)&cinfo->err->msg_code = 0x10000000039;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pJVar2[lVar6] = (JSAMPLE)R;
  pJVar3[lVar6] = (JSAMPLE)G;
  pJVar4[lVar6] = (JSAMPLE)B;
  cinfo->actual_number_of_colors = cinfo->actual_number_of_colors + 1;
  return;
}

Assistant:

LOCAL(void)
add_map_entry(j_decompress_ptr cinfo, int R, int G, int B)
{
  JSAMPROW colormap0 = cinfo->colormap[0];
  JSAMPROW colormap1 = cinfo->colormap[1];
  JSAMPROW colormap2 = cinfo->colormap[2];
  int ncolors = cinfo->actual_number_of_colors;
  int index;

  /* Check for duplicate color. */
  for (index = 0; index < ncolors; index++) {
    if (colormap0[index] == R && colormap1[index] == G &&
        colormap2[index] == B)
      return;                   /* color is already in map */
  }

  /* Check for map overflow. */
  if (ncolors >= (MAXJSAMPLE + 1))
    ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, (MAXJSAMPLE + 1));

  /* OK, add color to map. */
  colormap0[ncolors] = (JSAMPLE)R;
  colormap1[ncolors] = (JSAMPLE)G;
  colormap2[ncolors] = (JSAMPLE)B;
  cinfo->actual_number_of_colors++;
}